

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharMap.h
# Opt level: O2

void __thiscall
UnifiedRegex::CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1>::CharMap
          (CharMap<char16_t,_unsigned_long,_(UnifiedRegex::CharMapScheme)1> *this,unsigned_long defv
          )

{
  int i;
  long lVar1;
  
  (this->isInMap).data[2].word = 0;
  (this->isInMap).data[3].word = 0;
  (this->isInMap).data[0].word = 0;
  (this->isInMap).data[1].word = 0;
  this->defv = defv;
  this->root = (Type)0x0;
  for (lVar1 = 0; lVar1 != 0x100; lVar1 = lVar1 + 1) {
    this->directMap[lVar1] = defv;
  }
  return;
}

Assistant:

CharMap(V defv)
            : defv(defv)
            , root(0)
        {
            for (int i = 0; i < directSize; i++)
                directMap[i] = defv;
        }